

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O2

void __thiscall CLI::Option::set_custom_option(Option *this,string *typeval,int expected)

{
  ::std::__cxx11::string::_M_assign((string *)&this->typeval_);
  this->expected_ = expected;
  if (expected == 0) {
    (this->super_OptionBase<CLI::Option>).required_ = false;
  }
  this->changeable_ = SUB41((uint)expected >> 0x1f,0);
  return;
}

Assistant:

void set_custom_option(std::string typeval, int expected = 1) {
        typeval_ = typeval;
        expected_ = expected;
        if(expected == 0)
            required_ = false;
        changeable_ = expected < 0;
    }